

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

void __thiscall fp::Algorithm::Algorithm(Algorithm *this)

{
  array<std::array<bool,_16UL>,_16UL> *local_b0;
  array<std::array<bool,_16UL>,_16UL> *local_98;
  Node *local_78;
  Node *local_60;
  Algorithm *this_local;
  
  this->path_found_ = false;
  this->need_newpath_ = true;
  this->temp_goal_ = false;
  this->path_blocked = true;
  this->visited_Count = 0;
  Maze::Maze(&this->maze_info);
  this->current_direction_ = 'N';
  this->block_direction_ = '\0';
  *(undefined8 *)(this->current_node_)._M_elems = 0;
  *(undefined8 *)(this->parent_node_)._M_elems = 0;
  std::
  stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>::
  stack<std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
            ((stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
              *)&this->stack_);
  std::shared_ptr<fp::LandBasedRobot>::shared_ptr(&this->robot_,(nullptr_t)0x0);
  std::
  stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>::
  stack<std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
            ((stack<std::array<int,2ul>,std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
              *)&this->path_stack_);
  std::array<std::array<fp::Node,_16UL>,_16UL>::array(&this->node_info);
  local_60 = (Node *)&this->node_master_;
  memset(local_60,0,0x6000);
  do {
    local_78 = local_60;
    do {
      Node::Node(local_78);
      local_78 = local_78 + 1;
    } while (local_78 != local_60 + 0x10);
    local_60 = local_60 + 0x10;
  } while (local_60 != (Node *)&this->explored_node_);
  local_98 = &this->explored_node_;
  memset(local_98,0,0x100);
  do {
    local_98 = (array<std::array<bool,_16UL>,_16UL> *)(local_98->_M_elems + 1);
  } while (local_98 != &this->visited_node_);
  local_b0 = &this->visited_node_;
  memset(local_b0,0,0x100);
  do {
    local_b0 = (array<std::array<bool,_16UL>,_16UL> *)(local_b0->_M_elems + 1);
  } while (local_b0 != (array<std::array<bool,_16UL>,_16UL> *)&this->goal1_);
  (this->goal1_)._M_elems[0] = 8;
  (this->goal1_)._M_elems[1] = 7;
  (this->goal2_)._M_elems[0] = 8;
  (this->goal2_)._M_elems[1] = 8;
  (this->goal3_)._M_elems[0] = 7;
  (this->goal3_)._M_elems[1] = 8;
  (this->goal4_)._M_elems[0] = 7;
  (this->goal4_)._M_elems[1] = 7;
  memset(&this->end_goal_,0,8);
  return;
}

Assistant:

Algorithm() : path_found_{false}, need_newpath_{true}, current_direction_{'N'}, goal1_{8, 7},
                      goal2_{8, 8}, goal3_{7, 8}, goal4_{7, 7},
                      end_goal_{}, current_node_{}, block_direction_{}, stack_{}, path_stack_{}, parent_node_{},
                      visited_node_{}, node_master_{}, explored_node_{}, robot_{nullptr} {

        }